

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

void __thiscall QAbstractItemView::startDrag(QAbstractItemView *this,DropActions supportedActions)

{
  int dx1;
  DragDropMode DVar1;
  Int IVar2;
  int iVar3;
  QAbstractItemViewPrivate *r;
  qsizetype qVar4;
  long lVar5;
  QPoint *this_00;
  QWidget *pQVar6;
  DropAction in_ESI;
  QAbstractItemViewPrivate *in_RDI;
  long in_FS_OFFSET;
  DropAction defaultDropAction;
  QDrag *drag;
  QMimeData *data;
  QAbstractItemViewPrivate *d;
  QPixmap pixmap;
  QRect rect;
  QModelIndexList indexes;
  undefined4 in_stack_ffffffffffffff18;
  DropAction in_stack_ffffffffffffff1c;
  QWidget *in_stack_ffffffffffffff20;
  ushort in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2a;
  undefined1 in_stack_ffffffffffffff2b;
  undefined1 uVar7;
  QRect *in_stack_ffffffffffffff30;
  QPoint *p1;
  QAbstractItemViewPrivate *in_stack_ffffffffffffff40;
  QPoint *pQVar8;
  QAbstractItemViewPrivate *indexes_00;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 uStack_78;
  undefined8 local_74;
  QFlagsStorageHelper<Qt::DropAction,_4> local_68;
  QFlagsStorageHelper<Qt::DropAction,_4> local_64;
  QPoint local_60;
  QPoint local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  QList<QModelIndex> local_28;
  QFlagsStorage<Qt::DropAction> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  indexes_00 = in_RDI;
  local_c.i = in_ESI;
  r = d_func((QAbstractItemView *)0x80f587);
  local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemViewPrivate::selectedDraggableIndexes(in_stack_ffffffffffffff40);
  qVar4 = QList<QModelIndex>::size(&local_28);
  if ((qVar4 < 1) ||
     (lVar5 = (**(code **)(*(long *)r->model + 0xd0))(r->model,&local_28), lVar5 == 0))
  goto LAB_0080f92b;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  QRect::QRect((QRect *)in_stack_ffffffffffffff20);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemViewPrivate::renderToPixmap
            ((QAbstractItemViewPrivate *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             (QModelIndexList *)indexes_00,(QRect *)r);
  dx1 = (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                               super_QWidgetPrivate + 0x2b0))();
  (**(code **)(*(long *)&(in_RDI->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                         super_QWidgetPrivate + 0x2b8))();
  QRect::adjust(in_stack_ffffffffffffff30,dx1,
                CONCAT13(in_stack_ffffffffffffff2b,
                         CONCAT12(in_stack_ffffffffffffff2a,in_stack_ffffffffffffff28)),
                (int)((ulong)in_stack_ffffffffffffff20 >> 0x20),(int)in_stack_ffffffffffffff20);
  this_00 = (QPoint *)operator_new(0x10);
  QDrag::QDrag((QDrag *)this_00,(QObject *)in_RDI);
  p1 = this_00;
  QDrag::setPixmap((QPixmap *)this_00);
  QDrag::setMimeData((QMimeData *)this_00);
  pQVar8 = this_00;
  local_60 = QRect::topLeft((QRect *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  local_58 = ::operator-(p1,(QPoint *)
                            CONCAT44(dx1,CONCAT13(in_stack_ffffffffffffff2b,
                                                  CONCAT12(in_stack_ffffffffffffff2a,
                                                           in_stack_ffffffffffffff28))));
  QDrag::setHotSpot((QPoint *)pQVar8);
  DVar1 = dragDropMode((QAbstractItemView *)
                       CONCAT44(dx1,CONCAT13(in_stack_ffffffffffffff2b,
                                             CONCAT12(in_stack_ffffffffffffff2a,
                                                      in_stack_ffffffffffffff28))));
  if (DVar1 == InternalMove) {
    QFlags<Qt::DropAction>::operator&=((QFlags<Qt::DropAction> *)&local_c,-2);
  }
  uVar7 = false;
  if (r->defaultDropAction != IgnoreAction) {
    local_64.super_QFlagsStorage<Qt::DropAction>.i =
         (QFlagsStorage<Qt::DropAction>)
         QFlags<Qt::DropAction>::operator&
                   ((QFlags<Qt::DropAction> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_64);
    uVar7 = IVar2 != 0;
  }
  if ((bool)uVar7 == false) {
    local_68.super_QFlagsStorage<Qt::DropAction>.i =
         (QFlagsStorage<Qt::DropAction>)
         QFlags<Qt::DropAction>::operator&
                   ((QFlags<Qt::DropAction> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_68);
    in_stack_ffffffffffffff2a = 0;
    if (IVar2 != 0) {
      DVar1 = dragDropMode((QAbstractItemView *)
                           CONCAT44(dx1,CONCAT13(uVar7,(uint3)in_stack_ffffffffffffff28)));
      in_stack_ffffffffffffff2a = DVar1 != InternalMove;
    }
  }
  r->dropEventMoved = false;
  iVar3 = QDrag::exec((QFlags_conflict1 *)this_00,local_c.i);
  if ((iVar3 == 2) && ((r->dropEventMoved & 1U) == 0)) {
    DVar1 = dragDropMode((QAbstractItemView *)
                         CONCAT44(dx1,CONCAT13(uVar7,CONCAT12(in_stack_ffffffffffffff2a,
                                                              in_stack_ffffffffffffff28))));
    if (DVar1 == InternalMove) {
      in_stack_ffffffffffffff20 = (QWidget *)QDrag::target();
      pQVar6 = QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_ffffffffffffff20);
      if (in_stack_ffffffffffffff20 != pQVar6) goto LAB_0080f8d4;
    }
    QAbstractItemViewPrivate::clearOrRemove(in_RDI);
  }
LAB_0080f8d4:
  r->dropEventMoved = false;
  QRect::QRect((QRect *)in_stack_ffffffffffffff20);
  (r->dropIndicatorRect).x1 = (Representation)in_stack_ffffffffffffff84;
  (r->dropIndicatorRect).y1 = (Representation)uStack_78;
  (r->dropIndicatorRect).x2 = (Representation)(undefined4)local_74;
  (r->dropIndicatorRect).y2 = (Representation)local_74._4_4_;
  r->dropIndicatorPosition = OnItem;
  QPixmap::~QPixmap((QPixmap *)&local_50);
LAB_0080f92b:
  QList<QModelIndex>::~QList((QList<QModelIndex> *)0x80f938);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemView::startDrag(Qt::DropActions supportedActions)
{
    Q_D(QAbstractItemView);
    QModelIndexList indexes = d->selectedDraggableIndexes();
    if (indexes.size() > 0) {
        QMimeData *data = d->model->mimeData(indexes);
        if (!data)
            return;
        QRect rect;
        QPixmap pixmap = d->renderToPixmap(indexes, &rect);
        rect.adjust(horizontalOffset(), verticalOffset(), 0, 0);
        QDrag *drag = new QDrag(this);
        drag->setPixmap(pixmap);
        drag->setMimeData(data);
        drag->setHotSpot(d->pressedPosition - rect.topLeft());
        Qt::DropAction defaultDropAction = Qt::IgnoreAction;
        if (dragDropMode() == InternalMove)
            supportedActions &= ~Qt::CopyAction;
        if (d->defaultDropAction != Qt::IgnoreAction && (supportedActions & d->defaultDropAction))
            defaultDropAction = d->defaultDropAction;
        else if (supportedActions & Qt::CopyAction && dragDropMode() != QAbstractItemView::InternalMove)
            defaultDropAction = Qt::CopyAction;
        d->dropEventMoved = false;
        if (drag->exec(supportedActions, defaultDropAction) == Qt::MoveAction && !d->dropEventMoved) {
            if (dragDropMode() != InternalMove || drag->target() == viewport())
                d->clearOrRemove();
        }
        d->dropEventMoved = false;
        // Reset the drop indicator
        d->dropIndicatorRect = QRect();
        d->dropIndicatorPosition = OnItem;
    }
}